

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O3

CharTrie * __thiscall UnifiedRegex::CharTrie::Add(CharTrie *this,ArenaAllocator *allocator,Char c)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  int iVar4;
  CharTrieEntry *pCVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  Char CVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  
  iVar4 = this->count;
  if (iVar4 == 0) {
    iVar13 = 0;
LAB_00e5f773:
    iVar9 = this->capacity;
    if (iVar9 <= iVar4) {
      uVar11 = 4;
      if (4 < iVar9 * 2) {
        uVar11 = (ulong)(uint)(iVar9 * 2);
      }
      pCVar5 = (CharTrieEntry *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Realloc
                         (&allocator->
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                          this->children,(long)iVar9 << 5,uVar11 << 5);
      this->children = pCVar5;
      this->capacity = (int)uVar11;
      iVar4 = this->count;
    }
    if (iVar13 < iVar4) {
      lVar7 = (long)iVar4;
      lVar6 = lVar7 << 5;
      do {
        pCVar5 = this->children;
        lVar7 = lVar7 + -1;
        *(undefined2 *)((long)&pCVar5->c + lVar6) = *(undefined2 *)((long)&pCVar5[-1].c + lVar6);
        puVar1 = (undefined8 *)((long)pCVar5 + lVar6 + -0x18);
        uVar3 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pCVar5->node).children + lVar6);
        *puVar2 = *puVar1;
        puVar2[1] = uVar3;
        *(undefined4 *)((long)&(pCVar5->node).count + lVar6) =
             *(undefined4 *)((long)pCVar5 + lVar6 + -8);
        lVar6 = lVar6 + -0x20;
      } while (iVar13 < lVar7);
    }
    lVar7 = (long)iVar13;
    pCVar5 = this->children;
    pCVar5[lVar7].c = c;
    pCVar5[lVar7].node.isAccepting = false;
    pCVar5[lVar7].node.capacity = 0;
    pCVar5[lVar7].node.count = 0;
    pCVar5[lVar7].node.children = (CharTrieEntry *)0x0;
    this->count = this->count + 1;
    pCVar5 = this->children;
  }
  else {
    iVar9 = iVar4 + -1;
    pCVar5 = this->children;
    iVar8 = (iVar4 - (iVar9 >> 0x1f)) + -1 >> 1;
    lVar7 = (long)iVar8;
    CVar10 = pCVar5[lVar7].c;
    if (CVar10 != c) {
      iVar12 = 0;
      do {
        if ((ushort)CVar10 < (ushort)c) {
          iVar13 = iVar8 + 1;
          iVar12 = iVar13;
          if (iVar9 <= iVar8) goto LAB_00e5f773;
        }
        else {
          iVar13 = iVar8;
          if (iVar8 <= iVar12) goto LAB_00e5f773;
          iVar9 = iVar8 + -1;
        }
        iVar8 = (iVar9 + iVar12) / 2;
        lVar7 = (long)iVar8;
        CVar10 = pCVar5[lVar7].c;
      } while (CVar10 != c);
    }
  }
  return &pCVar5[lVar7].node;
}

Assistant:

CharTrie* CharTrie::Add(ArenaAllocator* allocator, Char c)
    {
        int i;
        if (!Find(c, i))
        {
            if (capacity <= count)
            {
                int newCapacity = max(capacity * 2, initCapacity);
                children = (CharTrieEntry*)allocator->Realloc(children, capacity * sizeof(CharTrieEntry), newCapacity * sizeof(CharTrieEntry));
                capacity = newCapacity;
            }

            for (int j = count; j > i; j--)
            {
                children[j].c = children[j - 1].c;
                children[j].node = children[j - 1].node;
            }
            children[i].c = c;
            children[i].node.Reset();
            count++;
        }
        return &children[i].node;
    }